

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::MultiReporter::addReporter(MultiReporter *this,IEventListenerPtr *reporter)

{
  IEventListener *pIVar1;
  ReporterPreferences *pRVar2;
  IEventListenerPtr *reporter_local;
  MultiReporter *this_local;
  
  pIVar1 = Detail::unique_ptr<Catch::IEventListener>::operator*(reporter);
  updatePreferences(this,pIVar1);
  pIVar1 = Detail::unique_ptr<Catch::IEventListener>::operator->(reporter);
  pRVar2 = Catch::IEventListener::getPreferences(pIVar1);
  this->m_haveNoncapturingReporters =
       (this->m_haveNoncapturingReporters & 1U) != 0 ||
       ((pRVar2->shouldRedirectStdOut ^ 0xffU) & 1) != 0;
  std::
  vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
  ::push_back(&this->m_reporterLikes,reporter);
  return;
}

Assistant:

void MultiReporter::addReporter( IEventListenerPtr&& reporter ) {
        updatePreferences(*reporter);

        // We will need to output the captured stdout if there are reporters
        // that do not want it captured.
        // We do not consider listeners, because it is generally assumed that
        // listeners are output-transparent, even though they can ask for stdout
        // capture to do something with it.
        m_haveNoncapturingReporters |= !reporter->getPreferences().shouldRedirectStdOut;

        // Reporters can always be placed to the back without breaking the
        // reporting order
        m_reporterLikes.push_back( CATCH_MOVE( reporter ) );
    }